

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

void __thiscall cmState::Snapshot::SetDefaultDefinitions(Snapshot *this)

{
  uint uVar1;
  char *pcVar2;
  PointerType pSVar3;
  PointerType pBVar4;
  allocator local_6c9;
  string local_6c8;
  allocator local_6a1;
  string local_6a0;
  allocator local_679;
  string local_678;
  allocator local_651;
  string local_650;
  allocator local_629;
  string local_628;
  allocator local_601;
  string local_600;
  allocator local_5d9;
  string local_5d8;
  allocator local_5b1;
  string local_5b0;
  allocator local_589;
  string local_588;
  allocator local_561;
  string local_560;
  allocator local_539;
  string local_538;
  allocator local_511;
  string local_510;
  allocator local_4e9;
  string local_4e8;
  char local_4c8 [8];
  char temp [1024];
  allocator local_b9;
  string local_b8;
  allocator local_91;
  string local_90;
  allocator local_69;
  string local_68;
  allocator local_31;
  string local_30;
  Snapshot *local_10;
  Snapshot *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"UNIX",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_68,"1",&local_69);
  SetDefinition(this,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"CMAKE_HOST_UNIX",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b8,"1",&local_b9);
  SetDefinition(this,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  uVar1 = cmVersion::GetMinorVersion();
  sprintf(local_4c8,"%d",(ulong)uVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4e8,"CMAKE_MINOR_VERSION",&local_4e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_510,local_4c8,&local_511);
  SetDefinition(this,&local_4e8,&local_510);
  std::__cxx11::string::~string((string *)&local_510);
  std::allocator<char>::~allocator((allocator<char> *)&local_511);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4e9);
  uVar1 = cmVersion::GetMajorVersion();
  sprintf(local_4c8,"%d",(ulong)uVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_538,"CMAKE_MAJOR_VERSION",&local_539);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_560,local_4c8,&local_561);
  SetDefinition(this,&local_538,&local_560);
  std::__cxx11::string::~string((string *)&local_560);
  std::allocator<char>::~allocator((allocator<char> *)&local_561);
  std::__cxx11::string::~string((string *)&local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  uVar1 = cmVersion::GetPatchVersion();
  sprintf(local_4c8,"%d",(ulong)uVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_588,"CMAKE_PATCH_VERSION",&local_589);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5b0,local_4c8,&local_5b1);
  SetDefinition(this,&local_588,&local_5b0);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5b1);
  std::__cxx11::string::~string((string *)&local_588);
  std::allocator<char>::~allocator((allocator<char> *)&local_589);
  uVar1 = cmVersion::GetTweakVersion();
  sprintf(local_4c8,"%d",(ulong)uVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_5d8,"CMAKE_TWEAK_VERSION",&local_5d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_600,local_4c8,&local_601);
  SetDefinition(this,&local_5d8,&local_600);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator((allocator<char> *)&local_601);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_628,"CMAKE_VERSION",&local_629);
  pcVar2 = cmVersion::GetCMakeVersion();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_650,pcVar2,&local_651);
  SetDefinition(this,&local_628,&local_650);
  std::__cxx11::string::~string((string *)&local_650);
  std::allocator<char>::~allocator((allocator<char> *)&local_651);
  std::__cxx11::string::~string((string *)&local_628);
  std::allocator<char>::~allocator((allocator<char> *)&local_629);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_678,"CMAKE_FILES_DIRECTORY",&local_679);
  pcVar2 = cmake::GetCMakeFilesDirectory();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6a0,pcVar2,&local_6a1);
  SetDefinition(this,&local_678,&local_6a0);
  std::__cxx11::string::~string((string *)&local_6a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6a1);
  std::__cxx11::string::~string((string *)&local_678);
  std::allocator<char>::~allocator((allocator<char> *)&local_679);
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&this->Position);
  pBVar4 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_6c8,"INCLUDE_REGULAR_EXPRESSION",&local_6c9);
  cmPropertyMap::SetProperty(&pBVar4->Properties,&local_6c8,"^.*$");
  std::__cxx11::string::~string((string *)&local_6c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_6c9);
  return;
}

Assistant:

void cmState::Snapshot::SetDefaultDefinitions()
{
  /* Up to CMake 2.4 here only WIN32, UNIX and APPLE were set.
    With CMake must separate between target and host platform. In most cases
    the tests for WIN32, UNIX and APPLE will be for the target system, so an
    additional set of variables for the host system is required ->
    CMAKE_HOST_WIN32, CMAKE_HOST_UNIX, CMAKE_HOST_APPLE.
    WIN32, UNIX and APPLE are now set in the platform files in
    Modules/Platforms/.
    To keep cmake scripts (-P) and custom language and compiler modules
    working, these variables are still also set here in this place, but they
    will be reset in CMakeSystemSpecificInformation.cmake before the platform
    files are executed. */
  #if defined(_WIN32)
    this->SetDefinition("WIN32", "1");
    this->SetDefinition("CMAKE_HOST_WIN32", "1");
  #else
    this->SetDefinition("UNIX", "1");
    this->SetDefinition("CMAKE_HOST_UNIX", "1");
  #endif
  #if defined(__CYGWIN__)
    if(cmSystemTools::IsOn(cmSystemTools::GetEnv("CMAKE_LEGACY_CYGWIN_WIN32")))
      {
      this->SetDefinition("WIN32", "1");
      this->SetDefinition("CMAKE_HOST_WIN32", "1");
      }
  #endif
  #if defined(__APPLE__)
    this->SetDefinition("APPLE", "1");
    this->SetDefinition("CMAKE_HOST_APPLE", "1");
  #endif

    char temp[1024];
    sprintf(temp, "%d", cmVersion::GetMinorVersion());
    this->SetDefinition("CMAKE_MINOR_VERSION", temp);
    sprintf(temp, "%d", cmVersion::GetMajorVersion());
    this->SetDefinition("CMAKE_MAJOR_VERSION", temp);
    sprintf(temp, "%d", cmVersion::GetPatchVersion());
    this->SetDefinition("CMAKE_PATCH_VERSION", temp);
    sprintf(temp, "%d", cmVersion::GetTweakVersion());
    this->SetDefinition("CMAKE_TWEAK_VERSION", temp);
    this->SetDefinition("CMAKE_VERSION",
                                      cmVersion::GetCMakeVersion());

    this->SetDefinition("CMAKE_FILES_DIRECTORY",
                        cmake::GetCMakeFilesDirectory());

  // Setup the default include file regular expression (match everything).
  this->Position->BuildSystemDirectory
      ->Properties.SetProperty("INCLUDE_REGULAR_EXPRESSION", "^.*$");
}